

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::lowerConvertIntToFloat(I64ToI32Lowering *this,Unary *curr)

{
  UnaryOp op;
  Builder *this_00;
  Builder *pBVar1;
  Builder *this_01;
  Builder *this_02;
  uint uVar2;
  Index IVar3;
  LocalSet *any;
  Const *pCVar4;
  LocalSet *append;
  LocalGet *pLVar5;
  Unary *left;
  Unary *right;
  Binary *pBVar6;
  Block *value;
  undefined1 local_c0 [8];
  TempVar highBits;
  TempVar highResult;
  TempVar lowBits;
  
  fetchOutParam((TempVar *)local_c0,this,curr->value);
  getTemp((TempVar *)&highResult.ty,this,(Type)0x2);
  getTemp((TempVar *)&highBits.ty,this,(Type)0x2);
  uVar2 = curr->op - ConvertSInt64ToFloat32;
  if (uVar2 < 4) {
    op = *(UnaryOp *)(&DAT_00ba6790 + (ulong)uVar2 * 4);
    this_00 = (this->builder)._M_t.
              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
              super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highResult.ty);
    any = Builder::makeLocalSet(this_00,IVar3,curr->value);
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highBits.ty);
    pCVar4 = Builder::makeConst<int>
                       ((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0);
    append = Builder::makeLocalSet(pBVar1,IVar3,(Expression *)pCVar4);
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highResult.ty);
    pLVar5 = Builder::makeLocalGet(pBVar1,IVar3,(Type)0x2);
    left = Builder::makeUnary(pBVar1,ConvertUInt32ToFloat64,(Expression *)pLVar5);
    this_01 = (this->builder)._M_t.
              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
              super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    pCVar4 = Builder::makeConst<double>(this_01,4294967296.0);
    this_02 = (this->builder)._M_t.
              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
              super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_c0);
    pLVar5 = Builder::makeLocalGet(this_02,IVar3,(Type)0x2);
    right = Builder::makeUnary(this_02,op,(Expression *)pLVar5);
    pBVar6 = Builder::makeBinary(this_01,MulFloat64,(Expression *)pCVar4,(Expression *)right);
    pBVar6 = Builder::makeBinary(pBVar1,AddFloat64,(Expression *)left,(Expression *)pBVar6);
    value = Builder::blockify<wasm::Binary*>(this_00,(Expression *)any,(Expression *)append,pBVar6);
    if ((curr->op == ConvertSInt64ToFloat32) || (curr->op == ConvertUInt64ToFloat32)) {
      value = (Block *)Builder::makeUnary((this->builder)._M_t.
                                          super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                          .super__Head_base<0UL,_wasm::Builder_*,_false>.
                                          _M_head_impl,DemoteFloat64,(Expression *)value);
    }
    Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
               (Expression *)value);
    TempVar::~TempVar((TempVar *)&highBits.ty);
    TempVar::~TempVar((TempVar *)&highResult.ty);
    TempVar::~TempVar((TempVar *)local_c0);
    return;
  }
  abort();
}

Assistant:

void lowerConvertIntToFloat(Unary* curr) {
    // Here the same strategy as `emcc` is taken which takes the two halves of
    // the 64-bit integer and creates a mathematical expression using float
    // arithmetic to reassemble the final floating point value.
    //
    // For example for i64 -> f32 we generate:
    //
    //  ((double) (unsigned) lowBits) +
    //      ((double) U32_MAX) * ((double) (int) highBits)
    //
    // Mostly just shuffling things around here with coercions and whatnot!
    // Note though that all arithmetic is done with f64 to have as much
    // precision as we can.
    //
    // NB: this is *not* accurate for i64 -> f32. Using f64s for intermediate
    // operations can give slightly inaccurate results in some cases, as we
    // round to an f64, then round again to an f32, which is not always the
    // same as a single rounding of i64 to f32 directly. Example:
    //
    //   #include <stdio.h>
    //   int main() {
    //     unsigned long long x = 18446743523953737727ULL;
    //     float y = x;
    //     double z = x;
    //     float w = z;
    //     printf("i64          : %llu\n"
    //            "i64->f32     : %f\n"
    //            "i64->f64     : %f\n"
    //            "i64->f64->f32: %f\n", x, y, z, w);
    //   }
    //
    //   i64          : 18446743523953737727
    //   i64->f32     : 18446742974197923840.000000 ;; correct rounding to f32
    //   i64->f64     : 18446743523953737728.000000 ;; correct rounding to f64
    //   i64->f64->f32: 18446744073709551616.000000 ;; incorrect rounding to f32
    //
    // This is even a problem if we use BigInts in JavaScript to represent
    // i64s, as Math.fround(BigInt) is not supported - the BigInt must be
    // converted to a Number first, so we again have that extra rounding.
    //
    // A more precise approach could use compiled floatdisf/floatundisf from
    // compiler-rt, but that is much larger and slower. (Note that we are in the
    // interesting situation of having f32 and f64 operations and only missing
    // i64 ones, so we have a different problem to solve than compiler-rt, and
    // maybe there is a better solution we haven't found yet.)
    TempVar highBits = fetchOutParam(curr->value);
    TempVar lowBits = getTemp();
    TempVar highResult = getTemp();

    UnaryOp convertHigh;
    switch (curr->op) {
      case ConvertSInt64ToFloat32:
      case ConvertSInt64ToFloat64:
        convertHigh = ConvertSInt32ToFloat64;
        break;
      case ConvertUInt64ToFloat32:
      case ConvertUInt64ToFloat64:
        convertHigh = ConvertUInt32ToFloat64;
        break;
      default:
        abort();
    }

    Expression* result = builder->blockify(
      builder->makeLocalSet(lowBits, curr->value),
      builder->makeLocalSet(highResult, builder->makeConst(int32_t(0))),
      builder->makeBinary(
        AddFloat64,
        builder->makeUnary(ConvertUInt32ToFloat64,
                           builder->makeLocalGet(lowBits, Type::i32)),
        builder->makeBinary(
          MulFloat64,
          builder->makeConst((double)UINT_MAX + 1),
          builder->makeUnary(convertHigh,
                             builder->makeLocalGet(highBits, Type::i32)))));

    switch (curr->op) {
      case ConvertSInt64ToFloat32:
      case ConvertUInt64ToFloat32: {
        result = builder->makeUnary(DemoteFloat64, result);
        break;
      }
      default:
        break;
    }

    replaceCurrent(result);
  }